

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<double>::emplace<double&>
          (QPodArrayOps<double> *this,qsizetype i,double *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  double *pdVar3;
  double *in_RDX;
  long in_RSI;
  QArrayDataPointer<double> *in_RDI;
  double *where;
  GrowthPosition pos;
  double tmp;
  bool detach;
  QArrayDataPointer<double> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  double dVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<double>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<double>::freeSpaceAtEnd(in_stack_ffffffffffffffc8), qVar2 != 0)) {
      pdVar3 = QArrayDataPointer<double>::end(in_RDI);
      *pdVar3 = *in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<double>::freeSpaceAtBegin(in_stack_ffffffffffffffc8), qVar2 != 0))
    {
      pdVar3 = QArrayDataPointer<double>::begin((QArrayDataPointer<double> *)0x5b3e79);
      pdVar3[-1] = *in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  dVar5 = *in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<double>::detachAndGrow
            ((QArrayDataPointer<double> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)dVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (double **)in_stack_ffffffffffffffc8,in_RDI);
  pdVar3 = createHole((QPodArrayOps<double> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                      (GrowthPosition)((ulong)dVar5 >> 0x20),
                      CONCAT44(uVar4,in_stack_ffffffffffffffd0),(qsizetype)in_stack_ffffffffffffffc8
                     );
  *pdVar3 = dVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }